

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_Writer::Write_Permute_(OSTEI_Writer *this,QAM *am,bool swap12,bool swap34)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ostream *poVar5;
  QAM *tam;
  ostream *poVar6;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  string idx;
  char vd;
  char vc;
  char vb;
  char va;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d2;
  size_t ncart_c2;
  size_t ncart_b2;
  size_t ncart_a2;
  size_t ncart_d;
  size_t ncart_c;
  size_t ncart_b;
  size_t ncart_abcd;
  string fname;
  char *Q_var;
  char *P_var;
  QAM permuted;
  QAM *in_stack_fffffffffffff928;
  int i;
  char *in_stack_fffffffffffff930;
  OSTEI_Writer *in_stack_fffffffffffff938;
  QAM *in_stack_fffffffffffff950;
  QAM *in_stack_fffffffffffff990;
  OSTEI_Writer *in_stack_fffffffffffff998;
  char (*in_stack_fffffffffffff9e8) [2];
  char *in_stack_fffffffffffff9f0;
  char (*in_stack_fffffffffffff9f8) [2];
  unsigned_long *in_stack_fffffffffffffa00;
  allocator *paVar7;
  char (*in_stack_fffffffffffffa08) [3];
  string *in_stack_fffffffffffffa10;
  QAM *in_stack_fffffffffffffa18;
  unsigned_long *in_stack_fffffffffffffa50;
  char (*in_stack_fffffffffffffa58) [2];
  char *in_stack_fffffffffffffa60;
  char (*in_stack_fffffffffffffa68) [2];
  unsigned_long *in_stack_fffffffffffffa70;
  char (*in_stack_fffffffffffffa78) [2];
  char *in_stack_fffffffffffffa80;
  char (*in_stack_fffffffffffffa88) [2];
  unsigned_long *in_stack_fffffffffffffa90;
  char (*in_stack_fffffffffffffa98) [2];
  char *in_stack_fffffffffffffaa0;
  QAM *in_stack_fffffffffffffc00;
  ostream *in_stack_fffffffffffffc08;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  string local_228 [36];
  char local_204 [4];
  long local_200;
  QAM local_1f8;
  long local_1c8;
  long local_1c0;
  ulong local_188;
  allocator local_149;
  string local_148 [32];
  string local_128 [80];
  string local_d8 [32];
  char *local_b8;
  char *local_b0;
  string local_78 [32];
  undefined4 local_58;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  if ((local_11 & 1) != 0) {
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    piVar4 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    std::swap<int>(piVar3,piVar4);
  }
  if ((local_12 & 1) != 0) {
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    piVar4 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    std::swap<int>(piVar3,piVar4);
  }
  if (((local_12 & 1) != 0) && ((local_11 & 1) == 0)) {
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    iVar2 = *piVar3;
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    if (iVar2 == *piVar3) {
      local_58 = 1;
      goto LAB_00158b4b;
    }
  }
  if (((local_11 & 1) != 0) && ((local_12 & 1) == 0)) {
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    iVar2 = *piVar3;
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    if (iVar2 == *piVar3) {
      local_58 = 1;
      goto LAB_00158b4b;
    }
  }
  if (((local_11 & 1) == 0) || ((local_12 & 1) == 0)) {
LAB_00157537:
    poVar5 = *(ostream **)(in_RDI + 8);
    QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    FunctionPrototype__abi_cxx11_
              ((OSTEI_Writer *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    poVar5 = std::operator<<(poVar5,local_78);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_78);
    QAM::~QAM((QAM *)0x1575d0);
    std::operator<<(*(ostream **)(in_RDI + 8),"{\n");
    local_b0 = "P";
    local_b8 = "Q";
    if ((local_11 & 1) != 0) {
      local_b0 = "P_tmp";
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"double P_AB[3*P.nshell12];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"struct simint_multi_shellpair P_tmp = P;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_x = P_AB;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_y = P_AB + P.nshell12;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n");
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"for(int i = 0; i < P.nshell12; i++)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"{\n");
      in_stack_fffffffffffffc08 =
           std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(in_stack_fffffffffffffc08,"P_tmp.AB_x[i] = -P.AB_x[i];\n");
      in_stack_fffffffffffffc00 =
           (QAM *)std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<((ostream *)in_stack_fffffffffffffc00,"P_tmp.AB_y[i] = -P.AB_y[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_z[i] = -P.AB_z[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"}\n\n");
    }
    if ((local_12 & 1) != 0) {
      local_b8 = "Q_tmp";
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"double Q_AB[3*Q.nshell12];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"struct simint_multi_shellpair Q_tmp = Q;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_x = Q_AB;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n");
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"for(int i = 0; i < Q.nshell12; i++)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"{\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"}\n\n");
    }
    QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    FunctionName__abi_cxx11_(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    QAM::~QAM((QAM *)0x157cb6);
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"int ret = ");
    poVar5 = std::operator<<(poVar5,local_d8);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_b0);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,local_b8);
    poVar5 = std::operator<<(poVar5,", screen_tol, ");
    poVar5 = std::operator<<(poVar5,"work, ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",&local_149);
    ArrVarName(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    poVar5 = std::operator<<(poVar5,local_128);
    std::operator<<(poVar5,");\n");
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    bVar1 = IsSpecialPermutation_(in_stack_fffffffffffff938,(QAM *)in_stack_fffffffffffff930);
    QAM::~QAM((QAM *)0x157ecb);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      i = (int)((ulong)in_stack_fffffffffffff928 >> 0x20);
      iVar2 = NCART(in_stack_fffffffffffff950);
      QAM::~QAM((QAM *)0x157f26);
      local_188 = (long)iVar2;
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1c0 = (long)iVar2;
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1c8 = (long)iVar2;
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1f8._40_8_ = SEXT48(iVar2);
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1f8._32_8_ = SEXT48(iVar2);
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1f8._24_8_ = SEXT48(iVar2);
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1f8._16_8_ = SEXT48(iVar2);
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,i);
      iVar2 = NCART(*piVar3);
      local_1f8.qam._M_elems._8_8_ = SEXT48(iVar2);
      local_1f8.qam._M_elems._0_8_ = local_1c0 * local_1c8 * local_1f8._40_8_;
      local_200 = local_1c8 * local_1f8._40_8_;
      builtin_strncpy(local_204,"dcba",4);
      if ((local_11 & 1) != 0) {
        std::swap<char>(local_204 + 3,local_204 + 2);
      }
      if ((local_12 & 1) != 0) {
        std::swap<char>(local_204 + 1,local_204);
      }
      in_stack_fffffffffffff930 = "+";
      in_stack_fffffffffffff928 = &local_1f8;
      StringBuilder<char[3],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
                (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                 in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffffa50,
                 in_stack_fffffffffffffa58,in_stack_fffffffffffffa60,in_stack_fffffffffffffa68,
                 in_stack_fffffffffffffa70,in_stack_fffffffffffffa78,in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa88,in_stack_fffffffffffffa90,in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffaa0);
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"double buffer[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_188);
      std::operator<<(poVar5,"] SIMINT_ALIGN_ARRAY_DBL;\n\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"for(int q = 0; q < ret; q++)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"{\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"int idx = 0;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"for(int a = 0; a < ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1f8._32_8_);
      std::operator<<(poVar5,"; ++a)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"for(int b = 0; b < ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1f8._24_8_);
      std::operator<<(poVar5,"; ++b)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"for(int c = 0; c < ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1f8._16_8_);
      std::operator<<(poVar5,"; ++c)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"for(int d = 0; d < ");
      tam = (QAM *)std::ostream::operator<<(poVar5,local_1f8.qam._M_elems._8_8_);
      std::operator<<((ostream *)tam,"; ++d)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar6 = std::operator<<(poVar5,"buffer[idx++] = ");
      paVar7 = &local_269;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"",paVar7);
      ArrVarName(tam,(string *)poVar5);
      poVar6 = std::operator<<(poVar6,local_248);
      poVar6 = std::operator<<(poVar6,"[");
      poVar6 = std::operator<<(poVar6,local_228);
      std::operator<<(poVar6,"];\n");
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      poVar6 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"memcpy(");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"",&local_2b1);
      ArrVarName(tam,(string *)poVar5);
      poVar5 = std::operator<<(poVar6,local_290);
      poVar5 = std::operator<<(poVar5,"+q*");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_188);
      poVar5 = std::operator<<(poVar5,", buffer, ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_188);
      std::operator<<(poVar5,"*sizeof(double));\n");
      std::__cxx11::string::~string(local_290);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"}\n");
      std::__cxx11::string::~string(local_228);
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    std::operator<<(poVar5,"return ret;\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"}\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = *(ostream **)(in_RDI + 0x10);
    QAM::QAM((QAM *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    FunctionPrototype__abi_cxx11_
              ((OSTEI_Writer *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    poVar5 = std::operator<<(poVar5,local_2d8);
    std::operator<<(poVar5,";\n\n");
    std::__cxx11::string::~string(local_2d8);
    QAM::~QAM((QAM *)0x158b33);
    std::__cxx11::string::~string(local_d8);
    local_58 = 0;
  }
  else {
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    iVar2 = *piVar3;
    piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                             (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    if (iVar2 != *piVar3) {
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
      iVar2 = *piVar3;
      piVar3 = QAM::operator[]((QAM *)in_stack_fffffffffffff930,
                               (int)((ulong)in_stack_fffffffffffff928 >> 0x20));
      if (iVar2 != *piVar3) goto LAB_00157537;
    }
    local_58 = 1;
  }
LAB_00158b4b:
  QAM::~QAM((QAM *)0x158b58);
  return;
}

Assistant:

void OSTEI_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
        Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
        os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    if(!IsSpecialPermutation_(permuted))
    {
        size_t ncart_abcd = NCART(am);
        //size_t ncart_a  = NCART(am[0]);
        size_t ncart_b  = NCART(am[1]);
        size_t ncart_c  = NCART(am[2]);
        size_t ncart_d  = NCART(am[3]);
        size_t ncart_a2 = NCART(permuted[0]);
        size_t ncart_b2 = NCART(permuted[1]);
        size_t ncart_c2 = NCART(permuted[2]);
        size_t ncart_d2 = NCART(permuted[3]);

        size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
        size_t ncart_cd = ncart_c * ncart_d;

        char va = 'a';
        char vb = 'b';
        char vc = 'c';
        char vd = 'd';

        if(swap12)
            std::swap(va, vb);
        if(swap34)
            std::swap(vc, vd);

        std::string idx = StringBuilder("q*", ncart_abcd,
                                        "+", va, "*", ncart_bcd,
                                        "+", vb, "*", ncart_cd,
                                        "+", vc, "*", ncart_d, "+", vd);

        os_ << indent1 << "double buffer[" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


        os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "int idx = 0;\n";
        os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
        os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
        os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
        os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
        os_ << indent3 << "buffer[idx++] = " << ArrVarName(permuted) << "[" << idx << "];\n";
        os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*" << ncart_abcd
                       << ", buffer, " << ncart_abcd << "*sizeof(double));\n";
        os_ << indent1 << "}\n";
    }

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}